

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O3

void ihevc_intra_pred_chroma_mode_27_to_33
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  UWORD8 *pUVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  if (0 < nt) {
    iVar1 = gai4_ihevc_ang_table_chroma[mode];
    pUVar2 = pu1_dst + 1;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + 1;
      uVar5 = iVar1 * (int)uVar4;
      uVar3 = uVar5 & 0x1f;
      iVar6 = ((int)uVar5 >> 4 & 0xfffffffeU) + nt * 4;
      uVar8 = 0;
      do {
        lVar7 = (long)(iVar6 + (int)uVar8);
        pUVar2[uVar8 - 1] =
             (UWORD8)((uint)pu1_ref[lVar7 + 2] * (0x20 - uVar3) + pu1_ref[lVar7 + 4] * uVar3 + 0x10
                     >> 5);
        lVar7 = (long)(iVar6 + 1 + (int)uVar8);
        pUVar2[uVar8] =
             (UWORD8)(pu1_ref[lVar7 + 4] * uVar3 + (uint)pu1_ref[lVar7 + 2] * (0x20 - uVar3) + 0x10
                     >> 5);
        uVar8 = uVar8 + 2;
      } while (uVar8 < (uint)(nt * 2));
      pUVar2 = pUVar2 + dst_strd;
    } while (uVar4 != (uint)nt);
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_27_to_33(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{
    WORD32 row, col;
    WORD32 pos, fract;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx_u, ref_main_idx_v;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);


        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = (4 * nt) + col + 2 * idx + 2;
            ref_main_idx_v = (4 * nt) + (col + 1) + 2 * idx + 2;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx_u]
                            + fract * pu1_ref[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(col + 1) + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx_v]
                            + fract * pu1_ref[ref_main_idx_v + 2] + 16) >> 5);

        }
    }

}